

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O3

bool SignSignature(SigningProvider *provider,CScript *fromPubKey,CMutableTransaction *txTo,uint nIn,
                  CAmount *amount,int nHashType,SignatureData *sig_data)

{
  pointer pCVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  MutableTransactionSignatureCreator MStack_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (ulong)nIn;
  uVar3 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x60,
                  "bool SignSignature(const SigningProvider &, const CScript &, CMutableTransaction &, unsigned int, const CAmount &, int, SignatureData &)"
                 );
  }
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (&MStack_88,txTo,nIn,amount,nHashType);
  bVar2 = ProduceSignature(provider,&MStack_88.super_BaseSignatureCreator,fromPubKey,sig_data);
  pCVar1 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
  }
  else {
    UpdateInput(pCVar1 + uVar4,sig_data);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CScript& fromPubKey, CMutableTransaction& txTo, unsigned int nIn, const CAmount& amount, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());

    MutableTransactionSignatureCreator creator(txTo, nIn, amount, nHashType);

    bool ret = ProduceSignature(provider, creator, fromPubKey, sig_data);
    UpdateInput(txTo.vin.at(nIn), sig_data);
    return ret;
}